

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O1

void __thiscall
t_delphi_generator::generate_deserialize_field
          (t_delphi_generator *this,ostream *out,bool is_xception,t_field *tfield,string *prefix,
          ostream *param_5)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  _func_int **pp_Var4;
  t_struct *tstruct;
  long *plVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_type *psVar8;
  long lVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined1 auVar12 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  ostream *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)tfield->type_;
  pp_Var4 = (tstruct->super_t_type).super_t_doc._vptr_t_doc;
  local_98 = param_5;
  while (iVar3 = (*pp_Var4[9])(tstruct), (char)iVar3 != '\0') {
    tstruct = (t_struct *)t_typedef::get_type((t_typedef *)tstruct);
    pp_Var4 = (tstruct->super_t_type).super_t_doc._vptr_t_doc;
  }
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar3 != '\0') {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_d8,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar7,&local_d8,&tfield->name_);
    __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  prop_name_abi_cxx11_(&local_b8,this,tfield,is_xception);
  plVar5 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_b8,0,(char *)0x0,(ulong)(prefix->_M_dataplus)._M_p);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d8.field_2._M_allocated_capacity = *psVar8;
    local_d8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar8;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  paVar11 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar11) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar3 == '\0')
     ) {
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar3 != '\0') {
      paVar11 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      generate_deserialize_container(this,out,is_xception,&tstruct->super_t_type,&local_90,local_98)
      ;
      local_b8._M_dataplus._M_p = local_90._M_dataplus._M_p;
      goto LAB_001e3b62;
    }
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
    if (((char)iVar3 != '\0') ||
       (iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct), (char)iVar3 != '\0'
       )) {
      poVar6 = indent_impl(this,out);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," := ",4);
      iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
      if ((char)iVar3 != '\0') {
        type_name_abi_cxx11_(&local_b8,this,&tstruct->super_t_type,false,false,false,false);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar11) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"iprot.",6);
      iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
        if ((char)iVar3 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(out,"ReadI32()",9);
          std::__ostream_insert<char,std::char_traits<char>>(out,");",2);
        }
      }
      else {
        uVar1 = *(uint *)&(tstruct->members_).
                          super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
        lVar9 = 0xb;
        switch(uVar1) {
        case 0:
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar7,"compiler error: cannot serialize void field in a struct: ",
                         &local_d8);
          __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case 1:
          iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
          if ((char)iVar3 == '\0') {
            lVar9 = 0xd;
            pcVar10 = "ReadString();";
          }
          else {
            pcVar10 = "ReadBinary();";
            if (this->ansistr_binary_ != false) {
              pcVar10 = "ReadAnsiString();";
            }
            lVar9 = (ulong)this->ansistr_binary_ * 4 + 0xd;
          }
          break;
        case 2:
          pcVar10 = "ReadBool();";
          break;
        case 3:
          pcVar10 = "ReadByte();";
          break;
        case 4:
          lVar9 = 10;
          pcVar10 = "ReadI16();";
          break;
        case 5:
          lVar9 = 10;
          pcVar10 = "ReadI32();";
          break;
        case 6:
          lVar9 = 10;
          pcVar10 = "ReadI64();";
          break;
        case 7:
          lVar9 = 0xd;
          pcVar10 = "ReadDouble();";
          break;
        default:
          auVar12 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_b8,(t_base_type *)(ulong)uVar1,auVar12._8_4_);
          std::operator+(auVar12._0_8_,"compiler error: no Delphi name for base type ",&local_b8);
          __cxa_throw(auVar12._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar10,lVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_001e3b6c;
    }
    pcVar2 = (tfield->name_)._M_dataplus._M_p;
    type_name_abi_cxx11_(&local_b8,this,&tstruct->super_t_type,false,false,false,false);
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar2,
           local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar11) goto LAB_001e3b6c;
  }
  else {
    paVar11 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    generate_deserialize_struct(this,out,tstruct,&local_50,&local_70);
    local_b8._M_dataplus._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
      local_b8._M_dataplus._M_p = local_50._M_dataplus._M_p;
    }
LAB_001e3b62:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar11) goto LAB_001e3b6c;
  }
  operator_delete(local_b8._M_dataplus._M_p);
LAB_001e3b6c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_delphi_generator::generate_deserialize_field(ostream& out,
                                                    bool is_xception,
                                                    t_field* tfield,
                                                    string prefix,
                                                    ostream& local_vars) {
  t_type* type = tfield->get_type();
  while (type->is_typedef()) {
    type = ((t_typedef*)type)->get_type();
  }

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + prop_name(tfield, is_xception);

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, name, "");
  } else if (type->is_container()) {
    generate_deserialize_container(out, is_xception, type, name, local_vars);
  } else if (type->is_base_type() || type->is_enum()) {
    indent_impl(out) << name << " := ";

    if (type->is_enum()) {
      out << type_name(type, false) << "(";
    }

    out << "iprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          if (ansistr_binary_) {
            out << "ReadAnsiString();";
          } else {
            out << "ReadBinary();";
          }
        } else {
          out << "ReadString();";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "ReadBool();";
        break;
      case t_base_type::TYPE_I8:
        out << "ReadByte();";
        break;
      case t_base_type::TYPE_I16:
        out << "ReadI16();";
        break;
      case t_base_type::TYPE_I32:
        out << "ReadI32();";
        break;
      case t_base_type::TYPE_I64:
        out << "ReadI64();";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "ReadDouble();";
        break;
      default:
        throw "compiler error: no Delphi name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "ReadI32()";
      out << ");";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}